

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void Assimp::insertMorphTimeValue
               (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
               float time,float weight,uint value)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *pvVar4;
  float extraout_XMM0_Da;
  __normal_iterator<Assimp::MorphTimeValues_*,_std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>_>
  local_e8;
  __normal_iterator<Assimp::MorphTimeValues_*,_std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>_>
  local_e0;
  const_iterator local_d8;
  undefined1 local_d0 [8];
  MorphTimeValues val_2;
  uint i;
  __normal_iterator<Assimp::MorphTimeValues_*,_std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>_>
  local_a0;
  const_iterator local_98;
  undefined1 local_90 [8];
  MorphTimeValues val_1;
  __normal_iterator<Assimp::MorphTimeValues_*,_std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>_>
  local_68;
  const_iterator local_60;
  undefined1 local_48 [8];
  MorphTimeValues val;
  key k;
  uint value_local;
  float weight_local;
  float time_local;
  vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values_local;
  
  val.mKeys.
  super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = weight;
  sVar1 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::size
                    (values);
  if ((sVar1 == 0) ||
     (pvVar2 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
               operator[](values,0), time < pvVar2->mTime)) {
    MorphTimeValues::MorphTimeValues((MorphTimeValues *)local_48);
    local_48._0_4_ = time;
    std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
    push_back((vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_> *
              )&val,(value_type *)
                    ((long)&val.mKeys.
                            super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_68._M_current =
         (MorphTimeValues *)
         std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::begin
                   (values);
    __gnu_cxx::
    __normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
    ::__normal_iterator<Assimp::MorphTimeValues*>
              ((__normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
                *)&local_60,&local_68);
    val_1.mKeys.
    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
                  insert(values,local_60,(value_type *)local_48);
    MorphTimeValues::~MorphTimeValues((MorphTimeValues *)local_48);
    return;
  }
  pvVar2 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::back
                     (values);
  if (pvVar2->mTime <= time && time != pvVar2->mTime) {
    MorphTimeValues::MorphTimeValues((MorphTimeValues *)local_90);
    local_90._0_4_ = time;
    std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
    push_back((vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_> *
              )&val_1,(value_type *)
                      ((long)&val.mKeys.
                              super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_a0._M_current =
         (MorphTimeValues *)
         std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::end(values)
    ;
    __gnu_cxx::
    __normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
    ::__normal_iterator<Assimp::MorphTimeValues*>
              ((__normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
                *)&local_98,&local_a0);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,local_98,(value_type *)local_90);
    MorphTimeValues::~MorphTimeValues((MorphTimeValues *)local_90);
    return;
  }
  val_2.mKeys.
  super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)val_2.mKeys.
                   super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar1 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::size
                      (values);
    if (sVar1 <= uVar3) {
      return;
    }
    pvVar4 = values;
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::operator[]
              (values,(ulong)val_2.mKeys.
                             super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::abs((int)pvVar4);
    if (extraout_XMM0_Da < 1e-06) break;
    pvVar2 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
             operator[](values,(ulong)val_2.mKeys.
                                      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    if ((pvVar2->mTime <= time && time != pvVar2->mTime) &&
       (pvVar2 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
                 operator[](values,(ulong)(val_2.mKeys.
                                           super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                          + 1)), time < pvVar2->mTime)) {
      MorphTimeValues::MorphTimeValues((MorphTimeValues *)local_d0);
      local_d0._0_4_ = time;
      std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
      push_back((vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                 *)&val_2,
                (value_type *)
                ((long)&val.mKeys.
                        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_e8._M_current =
           (MorphTimeValues *)
           std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::begin
                     (values);
      local_e0 = __gnu_cxx::
                 __normal_iterator<Assimp::MorphTimeValues_*,_std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>_>
                 ::operator+(&local_e8,
                             (ulong)val_2.mKeys.
                                    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      __gnu_cxx::
      __normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
      ::__normal_iterator<Assimp::MorphTimeValues*>
                ((__normal_iterator<Assimp::MorphTimeValues_const*,std::vector<Assimp::MorphTimeValues,std::allocator<Assimp::MorphTimeValues>>>
                  *)&local_d8,&local_e0);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
                (values,local_d8,(value_type *)local_d0);
      MorphTimeValues::~MorphTimeValues((MorphTimeValues *)local_d0);
      return;
    }
    val_2.mKeys.
    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         val_2.mKeys.
         super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  pvVar2 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
           operator[](values,(ulong)val_2.mKeys.
                                    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
  push_back(&pvVar2->mKeys,
            (value_type *)
            ((long)&val.mKeys.
                    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return;
}

Assistant:

void insertMorphTimeValue(std::vector<MorphTimeValues> &values, float time, float weight, unsigned int value)
{
    MorphTimeValues::key k;
    k.mValue = value;
    k.mWeight = weight;
    if (values.size() == 0 || time < values[0].mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.begin(), val);
        return;
    }
    if (time > values.back().mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.end(), val);
        return;
    }
    for (unsigned int i = 0; i < values.size(); i++)
    {
        if (std::abs(time - values[i].mTime) < 1e-6f)
        {
            values[i].mKeys.push_back(k);
            return;
        }
        else if (time > values[i].mTime && time < values[i + 1].mTime)
        {
            MorphTimeValues val;
            val.mTime = time;
            val.mKeys.push_back(k);
            values.insert(values.begin() + i, val);
            return;
        }
    }
    // should not get here
}